

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

IEnumerableCore<linq::TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
* __thiscall
linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::Take
          (IEnumerableCore<linq::TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
           *__return_storage_ptr__,
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
          *this,size_t count)

{
  TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int> TStack_68;
  
  TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>::TakeState
            (&TStack_68,&this->source,count);
  TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>::TakeState
            (&__return_storage_ptr__->source,&TStack_68);
  TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>::~TakeState
            (&TStack_68);
  return __return_storage_ptr__;
}

Assistant:

auto Take(size_t count) 
		{ 
			return IEnumerableCore<TakeState<S, T>>(
				TakeState<S, T>(std::move(source), count)
			);
		}